

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silent_printf.cpp
# Opt level: O3

INT Silent_PAL_vsnprintf(LPSTR Buffer,INT Count,LPCSTR Format,__va_list_tag *aparg)

{
  LPCWSTR pWVar1;
  long lVar2;
  LPCWSTR lpWideCharStr;
  BOOL BVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  errno_t eVar7;
  int iVar8;
  ulong uVar9;
  INT *pIVar10;
  byte *pbVar11;
  short *psVar12;
  LPCSTR pCVar13;
  undefined8 *puVar14;
  size_t sVar15;
  char cVar16;
  int *piVar17;
  long lVar18;
  uint *puVar19;
  LPSTR __s;
  int iVar20;
  INT Count_00;
  uint Flags_00;
  int iVar21;
  INT Padding;
  long lVar22;
  long in_FS_OFFSET;
  bool bVar23;
  undefined1 auStack_5d8 [8];
  CHAR TempBuffer [4];
  uint local_5bc;
  int local_5b8;
  INT Prefix;
  INT Type;
  LPCSTR Fmt;
  uint local_5a0;
  INT local_59c;
  INT Flags;
  int local_594;
  int iStack_590;
  INT Width;
  undefined1 auStack_588 [8];
  va_list ap;
  CHAR local_568 [8];
  CHAR TempStr [301];
  CHAR TempBuff [1024];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  ap[0].overflow_arg_area = aparg->reg_save_area;
  auStack_588._0_4_ = aparg->gp_offset;
  auStack_588._4_4_ = aparg->fp_offset;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  cVar16 = *Format;
  lVar22 = (long)Count;
  iVar20 = (int)Buffer;
  _Type = Format;
  local_59c = Count;
  _iStack_590 = Buffer;
  if (cVar16 == '\0') {
    bVar23 = true;
  }
  else {
    bVar23 = false;
    do {
      if (lVar22 <= (long)_iStack_590 - (long)Buffer) {
        bVar23 = false;
        goto LAB_00145545;
      }
      if ((cVar16 != '%') ||
         (BVar3 = Silent_ExtractFormatA
                            ((LPCSTR *)&Type,TempStr + 0x128,(LPINT)&local_5a0,&local_594,&Flags,
                             (LPINT)&local_5bc,&local_5b8), Flags_00 = local_5a0, iVar8 = local_5b8,
         uVar6 = local_5bc, BVar3 == 0)) {
        *_iStack_590 = *_Type;
        _Type = _Type + 1;
        _iStack_590 = _iStack_590 + 1;
        goto LAB_001452c4;
      }
      if (local_5b8 == 2 && (local_5bc ^ 2) == 0) {
        if (local_594 == -3) {
          if ((uint)auStack_588._0_4_ < 0x29) {
            auStack_588._0_4_ = auStack_588._0_4_ + 8;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          iVar8 = -3;
        }
        else {
          iVar8 = local_594;
          if (local_594 == -2) {
            uVar9 = (ulong)auStack_588 & 0xffffffff;
            if (uVar9 < 0x29) {
              auStack_588._0_4_ = auStack_588._0_4_ + 8;
              piVar17 = (int *)(uVar9 + (long)ap[0].overflow_arg_area);
            }
            else {
              piVar17 = (int *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            iVar8 = *piVar17;
            local_594 = iVar8;
          }
        }
        uVar9 = (ulong)auStack_588 & 0xffffffff;
        if (Flags == -4) {
          if ((uint)auStack_588._0_4_ < 0x29) {
            uVar9 = (ulong)(auStack_588._0_4_ + 8);
            auStack_588._0_4_ = auStack_588._0_4_ + 8;
            iVar5 = -4;
            goto LAB_00145046;
          }
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
          iVar5 = -4;
LAB_0014506d:
          puVar14 = (undefined8 *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        else {
          iVar5 = Flags;
          if (Flags == -2) {
            if ((uint)auStack_588._0_4_ < 0x29) {
              piVar17 = (int *)((long)ap[0].overflow_arg_area + uVar9);
              uVar9 = (ulong)(auStack_588._0_4_ + 8);
              auStack_588._0_4_ = auStack_588._0_4_ + 8;
            }
            else {
              piVar17 = (int *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            iVar5 = *piVar17;
          }
LAB_00145046:
          if (0x28 < (uint)uVar9) goto LAB_0014506d;
          auStack_588._0_4_ = (uint)uVar9 + 8;
          puVar14 = (undefined8 *)(uVar9 + (long)ap[0].overflow_arg_area);
        }
        lpWideCharStr = (LPCWSTR)*puVar14;
        if (lpWideCharStr != (LPCWSTR)0x0) {
          if (*lpWideCharStr == L'\0') {
            lVar18 = 1;
          }
          else {
            lVar18 = 1;
            do {
              pWVar1 = lpWideCharStr + lVar18;
              lVar18 = lVar18 + 1;
            } while (*pWVar1 != L'\0');
            if ((int)lVar18 == 0) goto LAB_00145591;
          }
          if (iVar5 == -3) {
            iVar5 = 300;
          }
          iVar4 = (int)lVar18;
          iVar21 = iVar4 + -1;
          Flags = iVar5;
          if ((iVar5 < 1) || (iVar21 <= iVar5)) {
            iVar5 = Silent_WideCharToMultiByte(lpWideCharStr,-1,local_568,iVar4);
            if (iVar5 != 0) goto LAB_0014511a;
            PAL_free(local_568);
          }
          else {
            iVar4 = Silent_WideCharToMultiByte(lpWideCharStr,iVar5,local_568,iVar4);
            if (iVar4 != 0) {
              local_568[iVar4] = '\0';
              iVar21 = iVar5;
LAB_0014511a:
              __s = local_568;
              Padding = iVar8 - iVar21;
              Count_00 = (iVar20 - iStack_590) + local_59c;
              Flags_00 = local_5a0;
              goto LAB_001452b6;
            }
          }
        }
LAB_00145591:
        iVar8 = -1;
        goto LAB_00145564;
      }
      if ((local_5bc ^ 2) == 0 && local_5b8 == 1) {
        uVar6 = auStack_588._0_4_;
        if (local_594 + 3U < 2) {
          if ((uint)auStack_588._0_4_ < 0x29) {
            auStack_588._0_4_ = auStack_588._0_4_ + 8;
            uVar6 = auStack_588._0_4_;
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((Flags & 0xfffffffdU) == 0xfffffffc) {
          if (uVar6 < 0x29) {
            uVar6 = uVar6 + 8;
            auStack_588._0_4_ = uVar6;
            goto LAB_0014516e;
          }
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
LAB_00145261:
          puVar19 = (uint *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        else {
LAB_0014516e:
          if (0x28 < uVar6) goto LAB_00145261;
          auStack_588._0_4_ = uVar6 + 8;
          puVar19 = (uint *)((ulong)uVar6 + (long)ap[0].overflow_arg_area);
        }
        auStack_5d8[0] = (byte)*puVar19;
        if ((*puVar19 & 0xff00) != 0) {
          auStack_5d8[0] = 0x3f;
        }
        auStack_5d8[1] = 0;
        Count_00 = (iVar20 - iStack_590) + local_59c;
        Padding = local_594 + -1;
        __s = auStack_5d8;
LAB_001452b6:
        BVar3 = Internal_AddPaddingA
                          ((LPSTR *)&stack0xfffffffffffffa70,Count_00,__s,Padding,Flags_00);
        bVar23 = BVar3 == 0;
      }
      else {
        if (local_5b8 != 6) {
          if (local_5b8 != 1) {
            if (local_5b8 == 2) {
              if ((local_5a0 & 4) == 0) goto LAB_001451a6;
              uVar9 = (ulong)auStack_588 & 0xffffffff;
              if (uVar9 < 0x29) {
                auStack_588._0_4_ = auStack_588._0_4_ + 8;
                puVar14 = (undefined8 *)(uVar9 + (long)ap[0].overflow_arg_area);
              }
              else {
                puVar14 = (undefined8 *)ap[0]._0_8_;
                ap[0]._0_8_ = ap[0]._0_8_ + 8;
              }
              __s = (LPSTR)*puVar14;
              sVar15 = strlen(__s);
              Count_00 = (iVar20 - iStack_590) + local_59c;
              Padding = local_594 - (int)sVar15;
              goto LAB_001452b6;
            }
            Fmt = Buffer + (lVar22 - (long)_iStack_590);
            if ((local_5b8 != 5 || (local_5bc ^ 1) != 0) && ((local_5bc ^ 1) != 0 || local_5b8 != 4)
               ) goto LAB_001451b4;
            uVar9 = (ulong)auStack_588 & 0xffffffff;
            if (uVar9 < 0x29) {
              auStack_588._0_4_ = auStack_588._0_4_ + 8;
              psVar12 = (short *)(uVar9 + (long)ap[0].overflow_arg_area);
            }
            else {
              psVar12 = (short *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            uVar6 = snprintf(_iStack_590,(size_t)Fmt,TempStr + 0x128,(ulong)(uint)(int)*psVar12);
LAB_001454af:
            if (((int)uVar6 < 0) || (pCVar13 = (LPCSTR)(ulong)uVar6, Fmt <= pCVar13)) {
              bVar23 = true;
              pCVar13 = Fmt;
            }
            _iStack_590 = pCVar13 + (long)_iStack_590;
            goto LAB_001452c4;
          }
          if ((local_5a0 & 4) != 0) {
            uVar9 = (ulong)auStack_588 & 0xffffffff;
            if (uVar9 < 0x29) {
              auStack_588._0_4_ = auStack_588._0_4_ + 8;
              pbVar11 = (byte *)(uVar9 + (long)ap[0].overflow_arg_area);
            }
            else {
              pbVar11 = (byte *)ap[0]._0_8_;
              ap[0]._0_8_ = ap[0]._0_8_ + 8;
            }
            auStack_5d8[1] = 0;
            auStack_5d8[0] = *pbVar11;
            Count_00 = (iVar20 - iStack_590) + local_59c;
            Padding = local_594 + -1;
            __s = auStack_5d8;
            goto LAB_001452b6;
          }
LAB_001451a6:
          Fmt = Buffer + (lVar22 - (long)_iStack_590);
LAB_001451b4:
          if (((TempStr[0x128] != '%') || (TempStr[0x129] != 's')) ||
             (eVar7 = strcpy_s(TempStr + 0x128,0x400,"%.300s"), eVar7 == 0)) {
            auStack_5d8 = auStack_588;
            _TempBuffer = (void *)ap[0]._0_8_;
            Prefix = PAL__vsnprintf(_iStack_590,(size_t)Fmt,TempStr + 0x128,
                                    (__va_list_tag *)auStack_5d8);
            PAL_printf_arg_remover((va_list *)auStack_588,local_594,Flags,iVar8,uVar6);
            uVar6 = Prefix;
            goto LAB_001454af;
          }
          goto LAB_00145591;
        }
        if (local_594 == -2) {
          uVar9 = (ulong)auStack_588 & 0xffffffff;
          if (uVar9 < 0x29) {
            auStack_588._0_4_ = auStack_588._0_4_ + 8;
            piVar17 = (int *)(uVar9 + (long)ap[0].overflow_arg_area);
          }
          else {
            piVar17 = (int *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          local_594 = *piVar17;
        }
        if (Flags == -2) {
          uVar9 = (ulong)auStack_588 & 0xffffffff;
          if (uVar9 < 0x29) {
            auStack_588._0_4_ = auStack_588._0_4_ + 8;
            pIVar10 = (INT *)(uVar9 + (long)ap[0].overflow_arg_area);
          }
          else {
            pIVar10 = (INT *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Flags = *pIVar10;
        }
        uVar9 = (ulong)auStack_588 & 0xffffffff;
        if (local_5bc == 1) {
          if ((uint)auStack_588._0_4_ < 0x29) {
            auStack_588._0_4_ = auStack_588._0_4_ + 8;
            puVar14 = (undefined8 *)(uVar9 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar14 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(short *)*puVar14 = (short)((long)_iStack_590 - (long)Buffer);
        }
        else {
          if ((uint)auStack_588._0_4_ < 0x29) {
            auStack_588._0_4_ = auStack_588._0_4_ + 8;
            puVar14 = (undefined8 *)(uVar9 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar14 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(int *)*puVar14 = (int)((long)_iStack_590 - (long)Buffer);
        }
      }
LAB_001452c4:
      cVar16 = *_Type;
    } while (cVar16 != '\0');
    bVar23 = !bVar23;
  }
LAB_00145545:
  if ((long)_iStack_590 - (long)Buffer < lVar22) {
    *_iStack_590 = '\0';
  }
  iVar8 = -1;
  if (bVar23) {
    iVar8 = iStack_590 - iVar20;
  }
LAB_00145564:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return iVar8;
}

Assistant:

INT Silent_PAL_vsnprintf(LPSTR Buffer, INT Count, LPCSTR Format, va_list aparg)
{
    BOOL BufferRanOut = FALSE;
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPSTR BufferPtr = Buffer;
    LPCSTR Fmt = Format;
    LPWSTR TempWStr;
    CHAR TempStr[MAX_STR_LEN+1];
    WCHAR TempWChar;
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT Length;
    INT TempInt;
    int wctombResult;
    va_list ap;
    
    va_copy(ap, aparg);

    while (*Fmt)
    {
        if ((BufferPtr - Buffer) >= Count)
        {
            BufferRanOut = TRUE;
            break;
        }
        else if(*Fmt == '%' &&
                TRUE == Silent_ExtractFormatA(&Fmt, TempBuff, &Flags,
                                                &Width, &Precision,
                                                &Prefix, &Type))
        {
            if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_STRING)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWStr = va_arg(ap, LPWSTR);
                Length = Silent_WideCharToMultiByte(TempWStr, -1, 0, 0);
                if (!Length)
                {
                    va_end(ap);
                    return -1;
                }

                /* clip string output to MAX_STR_LEN characters */
                if (PRECISION_DOT == Precision)
                {
                    Precision = MAX_STR_LEN;
                }

                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *TempStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length - 1)
                {
                    Length = Silent_WideCharToMultiByte(TempWStr, Precision, 
                                                        TempStr, Length);
                    if (!Length)
                    {
                        va_end(ap);
                        return -1;
                    }
                    TempStr[Length] = 0;
                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    wctombResult = Silent_WideCharToMultiByte(TempWStr, -1,
                                                              TempStr, Length);
                    if (!wctombResult)
                    {
                        PAL_free(TempStr);
                        va_end(ap);
                        return -1;
                    }
                    --Length; /* exclude null char */
                }

                /* do the padding (if needed)*/
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   TempStr,
                                                   Width - Length,
                                                   Flags);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                CHAR TempBuffer[4];

                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }
                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar = va_arg(ap, int);
                Length = Silent_WideCharToMultiByte(&TempWChar, 1, TempBuffer, 4);
                if (!Length)
                {
                    va_end(ap);
                    return -1;
                }
                TempBuffer[Length] = 0;

                /* do the padding (if needed)*/
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                                   Count - (BufferPtr - Buffer),
                                                   TempBuffer,
                                                   Width - Length,
                                                   Flags);

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = BufferPtr - Buffer;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = BufferPtr - Buffer;
                }
            }
            else if (Type == PFF_TYPE_CHAR && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of sprintf don't support 0-padded chars,
                // so we handle them here.
                char ch[2];

                ch[0] = (char) va_arg(ap, int);
                ch[1] = '\0';
                Length = 1;
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                           Count - (BufferPtr - Buffer),
                                           ch,
                                           Width - Length,
                                           Flags);
            }
            else if (Type == PFF_TYPE_STRING && (Flags & PFF_ZERO) != 0)
            {
                // Some versions of sprintf don't support 0-padded strings,
                // so we handle them here.
                char *tempStr;

                tempStr = va_arg(ap, char *);
                Length = strlen(tempStr);
                BufferRanOut = !Internal_AddPaddingA(&BufferPtr,
                                           Count - (BufferPtr - Buffer),
                                           tempStr,
                                           Width - Length,
                                           Flags);
            }
            /* types that sprintf can handle */
            else
            {
                size_t TempCount = Count - (BufferPtr - Buffer);

                TempInt = 0;
                /* %h (short) doesn't seem to be handled properly by local sprintf,
                   so lets do the truncation ourselves.  (ptr -> int -> short to avoid
                   warnings */
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;

                    TempInt = snprintf(BufferPtr, TempCount, TempBuff, trunc2);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short) n;

                    TempInt = snprintf(BufferPtr, TempCount, TempBuff, s);
                }
                else
                {
                    /* limit string output (%s) to 300 characters */
                    if(TempBuff[0] == '%' && TempBuff[1] == 's')
                    {
                        if (strcpy_s(TempBuff, sizeof(TempBuff), "%.300s") != SAFECRT_SUCCESS)
                        {
                            va_end(ap);
                            return -1;
                        }
                    }                                     
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = PAL__vsnprintf(BufferPtr, TempCount, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (TempInt < 0 || static_cast<size_t>(TempInt) >= TempCount) /* buffer not long enough */
                {
                    BufferPtr += TempCount;
                    BufferRanOut = TRUE;
                }
                else
                {
                    BufferPtr += TempInt;
                }
            }
        }
        else
        {
            *BufferPtr++ = *Fmt++; /* copy regular chars into buffer */
        }
    }

    if (Count > (BufferPtr - Buffer))
    {
        *BufferPtr = 0; /* end the string */
    }

    va_end(ap);

    if (BufferRanOut)
    {
        return -1;
    }
    else
    {
        return BufferPtr - Buffer;
    }
}